

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmCmpiEa<(moira::Instr)36,(moira::Mode)8,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  Ea<(moira::Mode)8,_1> dst;
  u32 local_3c;
  ushort local_38;
  uint local_34;
  
  *addr = *addr + 2;
  iVar3 = (*this->_vptr_Moira[6])();
  local_38 = op & 7;
  local_3c = *addr;
  *addr = local_3c + 2;
  iVar4 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[6])(this);
  local_34 = uVar5 & 0xffff | iVar4 << 0x10;
  cVar2 = 'c';
  lVar6 = 0;
  do {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = cVar2;
    cVar2 = "cmpi"[lVar6 + 1];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  pcVar7 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar7 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar7 = '.';
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
  }
  *pcVar7 = 'b';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
    pcVar7 = str->ptr;
  }
  else {
    iVar4 = (str->tab).raw;
    pcVar7 = str->ptr;
    do {
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
      pcVar7 = str->ptr;
    } while (pcVar7 < str->base + iVar4);
  }
  str->ptr = pcVar7 + 1;
  *pcVar7 = '#';
  StrWriter::operator<<(str,(Int)(int)(char)iVar3);
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_1> *)&local_3c);
  return;
}

Assistant:

void
Moira::dasmCmpiEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << Sep{} << dst;
    str << Av<I, M, S>{};
}